

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O3

int xmllintShellDu(xmllintShellCtxtPtr ctxt,char *arg,xmlNodePtr tree,xmlNodePtr node2)

{
  uint uVar1;
  char *pcVar2;
  int in_EAX;
  char *pcVar3;
  char *pcVar4;
  int iVar5;
  int iVar6;
  
  if (arg != (char *)0x0) {
    iVar6 = 0;
    pcVar4 = arg;
    do {
      uVar1 = *(uint *)(pcVar4 + 8);
      if ((uVar1 == 0xd) || (uVar1 == 9)) {
        fwrite("/\n",2,1,(FILE *)ctxt->output);
LAB_0010b6a3:
        uVar1 = *(uint *)(pcVar4 + 8);
      }
      else if (uVar1 == 1) {
        iVar5 = iVar6;
        if (0 < iVar6) {
          do {
            fwrite("  ",2,1,(FILE *)ctxt->output);
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
        if ((*(long *)(pcVar4 + 0x48) != 0) && (*(long *)(*(long *)(pcVar4 + 0x48) + 0x18) != 0)) {
          fprintf((FILE *)ctxt->output,"%s:");
        }
        fprintf((FILE *)ctxt->output,"%s\n",*(undefined8 *)(pcVar4 + 0x10));
        goto LAB_0010b6a3;
      }
      if ((uVar1 | 4) == 0xd) {
        pcVar3 = *(char **)(pcVar4 + 0x18);
      }
      else {
        pcVar3 = *(char **)(pcVar4 + 0x18);
        if (uVar1 == 5 || pcVar3 == (char *)0x0) {
          if (pcVar4 == arg) break;
          pcVar3 = *(char **)(pcVar4 + 0x30);
          if (pcVar3 == (char *)0x0) {
            do {
              pcVar3 = pcVar4;
              if (pcVar3 == arg) goto LAB_0010b71d;
              pcVar2 = *(char **)(pcVar3 + 0x28);
              pcVar4 = pcVar3;
              if (pcVar2 != (char *)0x0) {
                pcVar4 = pcVar2;
              }
              iVar6 = iVar6 - (uint)(pcVar2 != (char *)0x0);
              if (pcVar4 == arg) break;
              pcVar3 = *(char **)(pcVar4 + 0x30);
              if (pcVar3 != (char *)0x0) goto LAB_0010b71d;
            } while (*(long *)(pcVar4 + 0x28) != 0);
            pcVar3 = (char *)0x0;
LAB_0010b71d:
            if (pcVar3 == arg) break;
          }
        }
        else {
          iVar6 = iVar6 + 1;
        }
      }
      pcVar4 = pcVar3;
    } while (pcVar3 != (char *)0x0);
    in_EAX = (int)pcVar3;
  }
  return in_EAX;
}

Assistant:

static int
xmllintShellDu(xmllintShellCtxtPtr ctxt,
           char *arg ATTRIBUTE_UNUSED, xmlNodePtr tree,
           xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    xmlNodePtr node;
    int indent = 0, i;

    if (!ctxt)
	return (-1);

    if (tree == NULL)
        return (-1);
    node = tree;
    while (node != NULL) {
        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            fprintf(ctxt->output, "/\n");
        } else if (node->type == XML_ELEMENT_NODE) {
            for (i = 0; i < indent; i++)
                fprintf(ctxt->output, "  ");
            if ((node->ns) && (node->ns->prefix))
                fprintf(ctxt->output, "%s:", node->ns->prefix);
            fprintf(ctxt->output, "%s\n", node->name);
        } else {
        }

        /*
         * Browse the full subtree, deep first
         */

        if ((node->type == XML_DOCUMENT_NODE) ||
            (node->type == XML_HTML_DOCUMENT_NODE)) {
            node = ((xmlDocPtr) node)->children;
        } else if ((node->children != NULL)
                   && (node->type != XML_ENTITY_REF_NODE)) {
            /* deep first */
            node = node->children;
            indent++;
        } else if ((node != tree) && (node->next != NULL)) {
            /* then siblings */
            node = node->next;
        } else if (node != tree) {
            /* go up to parents->next if needed */
            while (node != tree) {
                if (node->parent != NULL) {
                    node = node->parent;
                    indent--;
                }
                if ((node != tree) && (node->next != NULL)) {
                    node = node->next;
                    break;
                }
                if (node->parent == NULL) {
                    node = NULL;
                    break;
                }
                if (node == tree) {
                    node = NULL;
                    break;
                }
            }
            /* exit condition */
            if (node == tree)
                node = NULL;
        } else
            node = NULL;
    }
    return (0);
}